

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O3

bool ON_ReverseKnotVector(int order,int cv_count,double *knot)

{
  double dVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  
  if ((order < 2) || (knot == (double *)0x0 || cv_count < order)) {
    bVar2 = false;
  }
  else {
    uVar6 = (order + cv_count) - 3;
    bVar2 = true;
    if (-1 < (int)uVar6) {
      lVar5 = -1;
      uVar4 = (ulong)uVar6;
      do {
        uVar3 = uVar4 - 1;
        dVar1 = knot[lVar5 + 1];
        knot[lVar5 + 1] = -knot[uVar4];
        knot[uVar4] = -dVar1;
        lVar5 = lVar5 + 1;
        uVar4 = uVar3;
      } while (lVar5 < (long)uVar3);
    }
  }
  return bVar2;
}

Assistant:

bool ON_ReverseKnotVector(
       int order,
       int cv_count,
       double* knot
       )
{
  if ( order < 2 || cv_count < order || knot == nullptr )
    return false;
  const int knot_count = (order+cv_count-2);
  double t;
  int i, j;
  for ( i = 0, j = knot_count-1; i <= j; i++, j-- ) {
    t = knot[i];
    knot[i] = -knot[j];
    knot[j] = -t;
  }
  return true;
}